

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O2

string * convertFilename(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  string text;
  string fpath;
  string local_40 [32];
  
  std::__cxx11::string::string((string *)&fpath,(string *)input);
  lVar2 = std::__cxx11::string::rfind((char *)&fpath,0x104004);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)&text);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&fpath);
    std::__cxx11::string::operator=((string *)&text,local_40);
    std::__cxx11::string::~string(local_40);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    uVar5 = (ulong)uVar4;
    if (text._M_string_length <= uVar5) {
      std::__cxx11::string::~string((string *)&text);
      std::__cxx11::string::~string((string *)&fpath);
      return __return_storage_ptr__;
    }
    iVar3 = (int)text._M_dataplus._M_p[uVar5];
    if ((iVar3 == 0x2e) || ((__return_storage_ptr__->_M_dataplus)._M_p[uVar5] == ' ')) {
LAB_0010243f:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      iVar1 = isalpha(iVar3);
      if (iVar3 - 0x30U < 10 || iVar1 != 0) goto LAB_0010243f;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::string convertFilename(const std::string &input) {
    std::string fpath=input;
    ssize_t pos = fpath.rfind("/");
    std::string text;
    if(pos != std::string::npos)
        text = fpath.substr(pos+1, fpath.length()-pos);
    else
        text = input;
    
    std::string temp;
    for(unsigned int i = 0; i < text.length(); ++i) {
        if(text[i] == '.' || temp[i] == ' ')
            temp += '_';
        else if(isalpha(text[i]) || isdigit(text[i]))
            temp += text[i];
    }
    return temp;
}